

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

matd_t * matd_create(int rows,int cols)

{
  uint __line;
  matd_t *pmVar1;
  char *__assertion;
  
  if (rows < 0) {
    __assertion = "rows >= 0";
    __line = 0x2f;
  }
  else {
    if (-1 < cols) {
      if (rows == 0 || cols == 0) {
        pmVar1 = matd_create_scalar(0.0);
        return pmVar1;
      }
      pmVar1 = (matd_t *)calloc(1,(ulong)(uint)(cols * rows) * 8 + 8);
      pmVar1->nrows = rows;
      pmVar1->ncols = cols;
      return pmVar1;
    }
    __assertion = "cols >= 0";
    __line = 0x30;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,__line,"matd_t *matd_create(int, int)");
}

Assistant:

matd_t *matd_create(int rows, int cols)
{
    assert(rows >= 0);
    assert(cols >= 0);

    if (rows == 0 || cols == 0)
        return matd_create_scalar(0);

    matd_t *m = calloc(1, sizeof(matd_t) + (rows*cols*sizeof(double)));
    m->nrows = rows;
    m->ncols = cols;

    return m;
}